

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O1

sexp_conflict
sexp_bytevector_ieee_double_native_set_x_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1,
          sexp_conflict arg2)

{
  sexp psVar1;
  sexp psVar2;
  sexp_conflict psVar3;
  
  if ((((ulong)arg0 & 3) != 0) || (arg0->tag != 8)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,8);
    return psVar3;
  }
  if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
    return psVar3;
  }
  if ((((ulong)arg2 & 3) != 0) || (arg2->tag != 0xb)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,0xb,arg2);
    return psVar3;
  }
  psVar2 = (sexp)((long)arg1 >> 1);
  psVar1 = psVar2;
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      psVar1 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
    }
    else {
      psVar1 = (sexp)0x0;
    }
  }
  if (-1 < (long)psVar1) {
    psVar1 = psVar2;
    if (((ulong)arg1 & 1) == 0) {
      if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
        psVar1 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
      }
      else {
        psVar1 = (sexp)0x0;
      }
    }
    if (psVar1 < (arg0->value).type.name) {
      if (((ulong)arg1 & 1) == 0) {
        if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
          psVar2 = (sexp)((long)(arg1->value).flonum_bits[0] * (arg1->value).uvector.length);
        }
        else {
          psVar2 = (sexp)0x0;
        }
      }
      *(double *)((long)&arg0->value + (long)(int)psVar2 + 8) = (arg2->value).flonum;
      return (sexp_conflict)0x43e;
    }
  }
  psVar3 = (sexp_conflict)
           sexp_user_exception_ls
                     (ctx,self,"assertion failed: (< -1 arg1 (bytevector-length arg0))",2,arg1,
                      (arg0->value).stack.length * 2 + 1);
  return psVar3;
}

Assistant:

sexp sexp_bytevector_ieee_double_native_set_x_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1, sexp arg2) {
  sexp res;
  if (! sexp_bytesp(arg0))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  if (! sexp_flonump(arg2))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg2);
  if (!((-1 < sexp_sint_value(arg1)) && (sexp_sint_value(arg1) < sexp_bytes_length(arg0)))) {
    return sexp_user_exception_ls(ctx, self, "assertion failed: " "(< -1 arg1 (bytevector-length arg0))", 2, arg1, sexp_make_fixnum(sexp_bytes_length(arg0)));
  }
  res = ((bytevector_ieee_double_native_set_x(sexp_bytes_data(arg0), sexp_sint_value(arg1), sexp_flonum_value(arg2))), SEXP_VOID);
  return res;
}